

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

WasmNode * __thiscall
Wasm::WasmBinaryReader::ReadInitExpr
          (WasmNode *__return_storage_ptr__,WasmBinaryReader *this,bool isOffset)

{
  code *pcVar1;
  undefined4 uVar2;
  uint32 uVar3;
  anon_union_4_2_52a1cc71_for_WasmBlock_1 aVar4;
  undefined4 uVar5;
  uint32 uVar6;
  undefined4 uVar7;
  WasmOp WVar8;
  undefined2 uVar9;
  bool bVar10;
  Type TVar11;
  uint uVar12;
  undefined4 *puVar13;
  WasmGlobal *this_00;
  WasmGlobal *global;
  uint32 globalIndex;
  bool isOffset_local;
  WasmBinaryReader *this_local;
  
  if (this->m_readerState != READER_STATE_MODULE) {
    ThrowDecodingError(this,L"Wasm reader in an invalid state to read init_expr");
  }
  (this->m_funcState).count = 0;
  (this->m_funcState).size = (int)(this->m_currentSection).end - (int)this->m_pc;
  if (this->m_pc + (this->m_funcState).size != (this->m_currentSection).end) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmBinaryReader.cpp"
                        ,0x527,"(m_pc + m_funcState.size == m_currentSection.end)",
                        "m_pc + m_funcState.size == m_currentSection.end");
    if (!bVar10) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  (*(this->super_WasmReaderBase)._vptr_WasmReaderBase[2])();
  WVar8 = (this->super_WasmReaderBase).m_currentNode.op;
  uVar9 = *(undefined2 *)&(this->super_WasmReaderBase).m_currentNode.field_0x2;
  uVar2 = *(undefined4 *)&(this->super_WasmReaderBase).m_currentNode.field_0x4;
  uVar3 = (this->super_WasmReaderBase).m_currentNode.field_1.br.depth;
  aVar4 = (this->super_WasmReaderBase).m_currentNode.field_1.block.field_1;
  uVar5 = *(undefined4 *)((long)&(this->super_WasmReaderBase).m_currentNode.field_1 + 0xc);
  uVar6 = (this->super_WasmReaderBase).m_currentNode.field_1.brTable.defaultTarget;
  uVar7 = *(undefined4 *)((long)&(this->super_WasmReaderBase).m_currentNode.field_1 + 0x14);
  *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) =
       *(undefined4 *)((long)&(this->super_WasmReaderBase).m_currentNode.field_1 + 8);
  *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0xc) = uVar5;
  (__return_storage_ptr__->field_1).brTable.defaultTarget = uVar6;
  *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x14) = uVar7;
  __return_storage_ptr__->op = WVar8;
  *(undefined2 *)&__return_storage_ptr__->field_0x2 = uVar9;
  *(undefined4 *)&__return_storage_ptr__->field_0x4 = uVar2;
  (__return_storage_ptr__->field_1).br.depth = uVar3;
  (__return_storage_ptr__->field_1).block.field_1 = aVar4;
  if (__return_storage_ptr__->op == 0x23) {
    this_00 = Js::WebAssemblyModule::GetGlobal
                        (this->m_module,(__return_storage_ptr__->field_1).brTable.numTargets);
    TVar11 = WasmGlobal::GetReferenceType(this_00);
    if (TVar11 != ImportedReference) {
      ThrowDecodingError(this,L"initializer expression can only use imported globals");
    }
    bVar10 = WasmGlobal::IsMutable(this_00);
    if (bVar10) {
      ThrowDecodingError(this,L"initializer expression cannot reference a mutable global");
    }
  }
  else if (3 < __return_storage_ptr__->op - 0x41) {
    ThrowDecodingError(this,L"Invalid initexpr opcode");
  }
  uVar12 = (*(this->super_WasmReaderBase)._vptr_WasmReaderBase[2])();
  if ((uVar12 & 0xffff) == 0xb) {
    if (isOffset) {
      Js::WebAssemblyModule::ValidateInitExportForOffset(this->m_module,__return_storage_ptr__);
    }
    return __return_storage_ptr__;
  }
  ThrowDecodingError(this,L"Missing end opcode after init expr");
}

Assistant:

WasmNode WasmBinaryReader::ReadInitExpr(bool isOffset)
{
    if (m_readerState != READER_STATE_MODULE)
    {
        ThrowDecodingError(_u("Wasm reader in an invalid state to read init_expr"));
    }

    m_funcState.count = 0;
    m_funcState.size = (uint32)(m_currentSection.end - m_pc);
#if TARGET_64
    Assert(m_pc + m_funcState.size == m_currentSection.end);
#endif
    ReadExpr();
    WasmNode node = m_currentNode;
    switch (node.op)
    {
    case wbI32Const:
    case wbF32Const:
    case wbI64Const:
    case wbF64Const:
        break;
    case wbGetGlobal:
    {
        uint32 globalIndex = node.var.num;
        WasmGlobal* global = m_module->GetGlobal(globalIndex);
        if (global->GetReferenceType() != GlobalReferenceTypes::ImportedReference)
        {
            ThrowDecodingError(_u("initializer expression can only use imported globals"));
        }
        if (global->IsMutable())
        {
            ThrowDecodingError(_u("initializer expression cannot reference a mutable global"));
        }
        break;
    }
    default:
        ThrowDecodingError(_u("Invalid initexpr opcode"));
    }

    if (ReadExpr() != wbEnd)
    {
        ThrowDecodingError(_u("Missing end opcode after init expr"));
    }
    if (isOffset)
    {
        m_module->ValidateInitExportForOffset(node);
    }
    return node;
}